

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_test_target.cc
# Opt level: O0

void __thiscall highwayhash::VectorTest<2U>::operator()(VectorTest<2U> *this,HHNotify notify)

{
  HHNotify notify_local;
  VectorTest<2U> *this_local;
  
  SSE41::anon_unknown_8::TestAll(notify);
  return;
}

Assistant:

void VectorTest<Target>::operator()(const HHNotify notify) const {
  HH_TARGET_NAME::TestAll(notify);
}